

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::initialize(XMLUri *this,XMLUri *toCopy)

{
  MemoryManager *manager;
  XMLCh *pXVar1;
  
  manager = toCopy->fMemoryManager;
  this->fMemoryManager = manager;
  pXVar1 = XMLString::replicate(toCopy->fScheme,manager);
  this->fScheme = pXVar1;
  pXVar1 = XMLString::replicate(toCopy->fUserInfo,this->fMemoryManager);
  this->fUserInfo = pXVar1;
  pXVar1 = XMLString::replicate(toCopy->fHost,this->fMemoryManager);
  this->fHost = pXVar1;
  this->fPort = toCopy->fPort;
  pXVar1 = XMLString::replicate(toCopy->fRegAuth,this->fMemoryManager);
  this->fRegAuth = pXVar1;
  pXVar1 = XMLString::replicate(toCopy->fPath,this->fMemoryManager);
  this->fPath = pXVar1;
  pXVar1 = XMLString::replicate(toCopy->fQueryString,this->fMemoryManager);
  this->fQueryString = pXVar1;
  pXVar1 = XMLString::replicate(toCopy->fFragment,this->fMemoryManager);
  this->fFragment = pXVar1;
  return;
}

Assistant:

void XMLUri::initialize(const XMLUri& toCopy)
{
    //
    // assuming that all fields from the toCopy are valid,
    // therefore need NOT to go through various setXXX() methods
    //
    fMemoryManager = toCopy.fMemoryManager;
    fScheme = XMLString::replicate(toCopy.fScheme, fMemoryManager);
    fUserInfo = XMLString::replicate(toCopy.fUserInfo, fMemoryManager);
    fHost = XMLString::replicate(toCopy.fHost, fMemoryManager);
    fPort = toCopy.fPort;
    fRegAuth = XMLString::replicate(toCopy.fRegAuth, fMemoryManager);
    fPath = XMLString::replicate(toCopy.fPath, fMemoryManager);
    fQueryString = XMLString::replicate(toCopy.fQueryString, fMemoryManager);
    fFragment = XMLString::replicate(toCopy.fFragment, fMemoryManager);
}